

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O0

void __thiscall
RenX::BanDatabase::add
          (BanDatabase *this,Server *server,PlayerInfo *player,string_view banner,string_view reason
          ,seconds length,uint16_t flags)

{
  uint32_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  byte bVar4;
  pointer pEVar5;
  rep rVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> **__n;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *this_01;
  reference ppPVar9;
  key_type *__k;
  mapped_type *this_02;
  reference this_03;
  void *__buf;
  string_view sVar10;
  Plugin *plugin;
  iterator __end1;
  iterator __begin1;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *__range1;
  string pluginData;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> local_40;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> entry;
  PlayerInfo *player_local;
  Server *server_local;
  BanDatabase *this_local;
  seconds length_local;
  string_view banner_local;
  
  length_local.__r = banner._M_len;
  entry._M_t.
  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>.
  _M_t.
  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>,_true,_true>
        )(__uniq_ptr_data<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>,_true,_true>
          )player;
  std::make_unique<RenX::BanDatabase::Entry>();
  if (flags != 0) {
    pEVar5 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_40);
    Entry::set_active(pEVar5);
    pEVar5 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_40);
    pEVar5->flags = pEVar5->flags | flags;
  }
  rVar6 = std::chrono::_V2::system_clock::now();
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  (pEVar5->timestamp).__d.__r = rVar6;
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  (pEVar5->length).__r = length.__r;
  uVar2 = *(uint64_t *)
           ((long)entry._M_t.
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xe8);
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  pEVar5->steamid = uVar2;
  uVar1 = *(uint32_t *)
           ((long)entry._M_t.
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xf0);
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  pEVar5->ip = uVar1;
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  pEVar5->prefix_length = ' ';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)entry._M_t.
                                   super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                                   .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>.
                                   _M_head_impl + 200),'0',0);
  if (sVar7 != 0xffffffffffffffff) {
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)entry._M_t.
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 200);
    pEVar5 = std::
             unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
             operator->(&local_40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&pEVar5->hwid,pbVar8);
  }
  sVar10 = PlayerInfo::get_rdns
                     ((PlayerInfo *)
                      entry._M_t.
                      super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                      .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl);
  __n = (vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> **)sVar10._M_len;
  pluginData.field_2._8_8_ = __n;
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::string::operator=
            ((string *)&pEVar5->rdns,
             (basic_string_view<char,_std::char_traits<char>_> *)((long)&pluginData.field_2 + 8));
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)entry._M_t.
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 8);
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar5->name,pbVar8);
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::string::operator=
            ((string *)&pEVar5->banner,
             (basic_string_view<char,_std::char_traits<char>_> *)&length_local);
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::string::operator=((string *)&pEVar5->reason,&reason);
  std::__cxx11::string::string((string *)&__range1);
  this_00 = getCore();
  this_01 = Core::getPlugins(this_00);
  __end1 = std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::begin(this_01);
  plugin = (Plugin *)std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::end(this_01);
  while (bVar3 = __gnu_cxx::
                 operator==<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                           (&__end1,(__normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                                     *)&plugin), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppPVar9 = __gnu_cxx::
              __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
              ::operator*(&__end1);
    __n = &__range1;
    bVar4 = (**(code **)(*(long *)*ppPVar9 + 0x130))
                      (*ppPVar9,server,
                       entry._M_t.
                       super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                       .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl);
    if (((bVar4 & 1) != 0) &&
       (bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1
                     ), !bVar3)) {
      pEVar5 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::operator->(&local_40);
      __k = (key_type *)Jupiter::Plugin::getName_abi_cxx11_();
      this_02 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&pEVar5->varData,__k);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range1);
    }
    __gnu_cxx::
    __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  ::push_back(&this->m_entries,&local_40);
  this_03 = std::
            vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
            ::back(&this->m_entries);
  pEVar5 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::get(this_03);
  write(this,(int)pEVar5,__buf,(size_t)__n);
  std::__cxx11::string::~string((string *)&__range1);
  std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
  ~unique_ptr(&local_40);
  return;
}

Assistant:

void RenX::BanDatabase::add(RenX::Server *server, const RenX::PlayerInfo &player, std::string_view banner, std::string_view reason, std::chrono::seconds length, uint16_t flags) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	if (flags != 0) {
		entry->set_active();
		entry->flags |= flags;
	}
	entry->timestamp = std::chrono::system_clock::now();
	entry->length = length;
	entry->steamid = player.steamid;
	entry->ip = player.ip32;
	entry->prefix_length = 32U;
	if (player.hwid.find_first_not_of('0') != std::string::npos) {
		entry->hwid = player.hwid;
	}
	entry->rdns = player.get_rdns();
	entry->name = player.name;
	entry->banner = banner;
	entry->reason = reason;

	// add plugin data
	std::string pluginData;
	for (Plugin* plugin : RenX::getCore()->getPlugins()) {
		if (plugin->RenX_OnBan(*server, player, pluginData)) {
			if (!pluginData.empty()) {
				entry->varData[plugin->getName()] = pluginData;
			}
		}
	}

	m_entries.push_back(std::move(entry));
	write(m_entries.back().get());
}